

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O2

void writeDualSolution<double>
               (SoPlexBase<double> *soplex,char *filename,NameSet *colnames,NameSet *rownames,
               bool real,bool rational,bool append)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  long lVar2;
  Real RVar3;
  double dVar4;
  pointer pdVar5;
  pointer pnVar6;
  bool bVar7;
  long lVar8;
  ostream *poVar9;
  long lVar10;
  int i;
  long lVar11;
  long lVar12;
  VectorBase<double> redcost;
  double local_2d8;
  VectorRational redcost_1;
  longlong local_280;
  VectorBase<double> dual;
  ofstream outfile;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228 [63];
  
  psVar1 = &soplex->_tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&outfile,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar3 = ::soplex::Tolerances::epsilon(_outfile);
  dVar4 = log10(RVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  std::ofstream::ofstream(&outfile);
  std::ofstream::open((char *)&outfile,(_Ios_Openmode)filename);
  lVar10 = (long)((int)-dVar4 + 10);
  lVar8 = (long)(int)-dVar4;
  if (real) {
    ::soplex::VectorBase<double>::VectorBase
              (&dual,(soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                     thenum);
    bVar7 = ::soplex::SoPlexBase<double>::getDualFarkas(soplex,&dual);
    if (bVar7) {
      std::operator<<((ostream *)&outfile,"\nDual ray (name, value):\n");
      for (lVar11 = 0;
          lVar11 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar11 = lVar11 + 1) {
        local_2d8 = dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&redcost,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar3 = ::soplex::Tolerances::epsilon
                          ((Tolerances *)
                           redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
        local_2d8 = ABS(local_2d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        if (RVar3 < local_2d8) {
          poVar9 = std::operator<<((ostream *)&outfile,
                                   rownames->mem +
                                   (rownames->set).theitem[(rownames->set).thekey[lVar11].idx].data)
          ;
          poVar9 = std::operator<<(poVar9,"\t");
          lVar12 = *(long *)poVar9;
          *(long *)(poVar9 + *(long *)(lVar12 + -0x18) + 0x10) = lVar10;
          *(long *)(poVar9 + *(long *)(lVar12 + -0x18) + 8) = lVar8;
          poVar9 = std::ostream::_M_insert<double>
                             (dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar11]);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
      }
      poVar9 = std::operator<<((ostream *)&outfile,"All other entries are zero (within ");
      lVar11 = *(long *)poVar9;
      *(undefined8 *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = 1;
      lVar11 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 0x100;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&redcost,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar3 = ::soplex::Tolerances::epsilon
                        ((Tolerances *)
                         redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
      poVar9 = std::ostream::_M_insert<double>(RVar3);
      lVar11 = *(long *)poVar9;
      *(undefined8 *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = 8;
      lVar11 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 4;
      poVar9 = std::operator<<(poVar9,").");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
    else {
      bVar7 = ::soplex::SoPlexBase<double>::isDualFeasible(soplex);
      if ((bVar7) && (bVar7 = ::soplex::SoPlexBase<double>::getDual(soplex,&dual), bVar7)) {
        std::operator<<((ostream *)&outfile,"\nDual solution (name, value):\n");
        for (lVar11 = 0;
            lVar11 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                     thenum; lVar11 = lVar11 + 1) {
          local_2d8 = dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11];
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&redcost,
                     &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          RVar3 = ::soplex::Tolerances::epsilon
                            ((Tolerances *)
                             redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_start);
          local_2d8 = ABS(local_2d8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          if (RVar3 < local_2d8) {
            poVar9 = std::operator<<((ostream *)&outfile,
                                     rownames->mem +
                                     (rownames->set).theitem[(rownames->set).thekey[lVar11].idx].
                                     data);
            poVar9 = std::operator<<(poVar9,"\t");
            lVar12 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar12 + -0x18) + 0x10) = lVar10;
            *(long *)(poVar9 + *(long *)(lVar12 + -0x18) + 8) = lVar8;
            poVar9 = std::ostream::_M_insert<double>
                               (dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar11]);
            std::endl<char,std::char_traits<char>>(poVar9);
          }
        }
        poVar9 = std::operator<<((ostream *)&outfile,"All other dual values are zero (within ");
        lVar11 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = 1;
        lVar11 = *(long *)(lVar11 + -0x18);
        *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 0x100;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&redcost,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar3 = ::soplex::Tolerances::epsilon
                          ((Tolerances *)
                           redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
        poVar9 = std::ostream::_M_insert<double>(RVar3);
        lVar11 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = 8;
        lVar11 = *(long *)(lVar11 + -0x18);
        *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 4;
        poVar9 = std::operator<<(poVar9,").");
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        ::soplex::VectorBase<double>::VectorBase
                  (&redcost,(soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.
                            set.thenum);
        bVar7 = ::soplex::SoPlexBase<double>::getRedCost(soplex,&redcost);
        if (bVar7) {
          std::operator<<((ostream *)&outfile,"\nReduced costs (name, value):\n");
          for (lVar11 = 0;
              lVar11 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                       thenum; lVar11 = lVar11 + 1) {
            local_2d8 = redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11];
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&redcost_1,
                       &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            RVar3 = ::soplex::Tolerances::epsilon
                              ((Tolerances *)
                               redcost_1.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            local_2d8 = ABS(local_2d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &redcost_1.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            if (RVar3 < local_2d8) {
              poVar9 = std::operator<<((ostream *)&outfile,
                                       colnames->mem +
                                       (colnames->set).theitem[(colnames->set).thekey[lVar11].idx].
                                       data);
              poVar9 = std::operator<<(poVar9,"\t");
              lVar12 = *(long *)poVar9;
              *(long *)(poVar9 + *(long *)(lVar12 + -0x18) + 0x10) = lVar10;
              *(long *)(poVar9 + *(long *)(lVar12 + -0x18) + 8) = lVar8;
              poVar9 = std::ostream::_M_insert<double>
                                 (redcost.val.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar11]);
              std::endl<char,std::char_traits<char>>(poVar9);
            }
          }
          poVar9 = std::operator<<((ostream *)&outfile,"All other reduced costs are zero (within ");
          lVar11 = *(long *)poVar9;
          *(undefined8 *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = 1;
          lVar11 = *(long *)(lVar11 + -0x18);
          *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 0x100
          ;
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&redcost_1,
                     &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          RVar3 = ::soplex::Tolerances::epsilon
                            ((Tolerances *)
                             redcost_1.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          poVar9 = std::ostream::_M_insert<double>(RVar3);
          lVar11 = *(long *)poVar9;
          *(undefined8 *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = 8;
          lVar11 = *(long *)(lVar11 + -0x18);
          *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 4;
          poVar9 = std::operator<<(poVar9,").");
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &redcost_1.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&redcost);
      }
      else {
        std::operator<<((ostream *)&outfile,"No dual information available.\n");
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&dual);
  }
  if (rational) {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&redcost,
                 (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar7 = ::soplex::SoPlexBase<double>::getDualFarkasRational
                      (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)&redcost);
    if (bVar7) {
      std::operator<<((ostream *)&outfile,"\nDual ray (name, value):\n");
      lVar11 = 0;
      for (lVar12 = 0;
          pdVar5 = redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
          lVar12 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar12 = lVar12 + 1) {
        redcost_1.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&dual,(longlong *)&redcost_1,(type *)0x0);
        bVar7 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)((long)pdVar5 + lVar11),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&dual);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&dual);
        if (bVar7) {
          poVar9 = std::operator<<((ostream *)&outfile,
                                   rownames->mem +
                                   (rownames->set).theitem[(rownames->set).thekey[lVar12].idx].data)
          ;
          poVar9 = std::operator<<(poVar9,"\t");
          lVar2 = *(long *)poVar9;
          *(long *)(poVar9 + *(long *)(lVar2 + -0x18) + 0x10) = lVar10;
          *(long *)(poVar9 + *(long *)(lVar2 + -0x18) + 8) = lVar8;
          poVar9 = boost::multiprecision::operator<<
                             (poVar9,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)((long)redcost.val.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start + lVar11));
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        lVar11 = lVar11 + 0x40;
      }
      poVar9 = std::operator<<((ostream *)&outfile,"All other entries are zero.");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    bVar7 = ::soplex::SoPlexBase<double>::isDualFeasible(soplex);
    if ((bVar7) &&
       (bVar7 = ::soplex::SoPlexBase<double>::getDualRational
                          (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)&redcost), bVar7)) {
      std::operator<<((ostream *)&outfile,"\nDual solution (name, value):\n");
      lVar8 = 0;
      for (lVar10 = 0;
          pdVar5 = redcost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
          lVar10 < (soplex->_rationalLP->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   .set.thenum; lVar10 = lVar10 + 1) {
        redcost_1.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&dual,(longlong *)&redcost_1,(type *)0x0);
        bVar7 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)((long)pdVar5 + lVar8),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&dual);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&dual);
        if (bVar7) {
          poVar9 = std::operator<<((ostream *)&outfile,
                                   rownames->mem +
                                   (rownames->set).theitem[(rownames->set).thekey[lVar10].idx].data)
          ;
          poVar9 = std::operator<<(poVar9,"\t");
          poVar9 = boost::multiprecision::operator<<
                             (poVar9,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)((long)redcost.val.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start + lVar8));
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        lVar8 = lVar8 + 0x40;
      }
      poVar9 = std::operator<<((ostream *)&outfile,"All other dual values are zero.");
      std::endl<char,std::char_traits<char>>(poVar9);
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase(&redcost_1,
                   (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)
      ;
      bVar7 = ::soplex::SoPlexBase<double>::getRedCostRational(soplex,&redcost_1);
      if (bVar7) {
        std::operator<<((ostream *)&outfile,"\nReduced costs (name, value):\n");
        lVar8 = 0;
        for (lVar10 = 0;
            pnVar6 = redcost_1.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            lVar10 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                     thenum; lVar10 = lVar10 + 1) {
          local_280 = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&dual,&local_280,(type *)0x0);
          bVar7 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)((long)&(pnVar6->m_backend).m_value.num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar8),
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)&dual);
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&dual);
          if (bVar7) {
            poVar9 = std::operator<<((ostream *)&outfile,
                                     colnames->mem +
                                     (colnames->set).theitem[(colnames->set).thekey[lVar10].idx].
                                     data);
            poVar9 = std::operator<<(poVar9,"\t");
            poVar9 = boost::multiprecision::operator<<
                               (poVar9,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                        *)((long)&((redcost_1.val.
                                                                                                        
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  m_backend).m_value.num.m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar8));
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          lVar8 = lVar8 + 0x40;
        }
        poVar9 = std::operator<<((ostream *)&outfile,"All other reduced costs are zero.");
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::~vector(&redcost_1.val);
    }
    else {
      std::operator<<((ostream *)&outfile,"No dual (rational) solution available.\n");
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               *)&redcost);
  }
  std::ofstream::~ofstream(&outfile);
  return;
}

Assistant:

static
void writeDualSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                       NameSet& rownames,
                       bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         outfile << "\nDual ray (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed << ")." << std::endl;
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         outfile << "\nDual solution (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other dual values are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed << ")." << std::endl;

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            outfile << "\nReduced costs (name, value):\n";

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  outfile << colnames[i] << "\t"
                          << std::setw(printwidth) << std::setprecision(printprec)
                          << redcost[i] << std::endl;
               }
            }

            outfile << "All other reduced costs are zero (within "
                    << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                    << std::setprecision(8) << std::fixed << ")." << std::endl;
         }
      }
      else
         outfile << "No dual information available.\n";
   }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         outfile << "\nDual ray (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth)
                       << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other entries are zero." << std::endl;
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         outfile << "\nDual solution (name, value):\n";

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               outfile << rownames[i] << "\t" << dual[i] << std::endl;
         }

         outfile << "All other dual values are zero." << std::endl;

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            outfile << "\nReduced costs (name, value):\n";

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  outfile << colnames[i] << "\t" << redcost[i] << std::endl;
            }

            outfile << "All other reduced costs are zero." << std::endl;
         }
      }
      else
         outfile << "No dual (rational) solution available.\n";
   }
}